

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2>::
expand(DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2>
       *this)

{
  undefined4 uVar1;
  uint *__ptr;
  Occurrences val;
  undefined8 uVar2;
  Entry *pEVar3;
  Formula *in_RDI;
  Entry *ep;
  int oldCapacity;
  uint oldTimestamp;
  Entry *oldAfterLast;
  Entry *oldEntries;
  void *mem;
  int newCapacity;
  size_t in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffb0;
  uint *puVar4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffcc;
  Connective CVar6;
  Exception *in_stack_ffffffffffffffd0;
  uint *puVar7;
  
  if (0x1c < *(int *)&(in_RDI->_label).field_0x4) {
    uVar2 = __cxa_allocate_exception(0x28);
    Lib::Exception::Exception
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    __cxa_throw(uVar2,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
  }
  uVar1 = *(undefined4 *)
           (DHMapTableCapacities + (long)(*(int *)&(in_RDI->_label).field_0x4 + 1) * 4);
  Lib::alloc(in_stack_ffffffffffffffa0);
  __ptr = *(uint **)&(in_RDI->_label).field_2;
  puVar7 = *(uint **)((long)&(in_RDI->_label).field_2 + 8);
  CVar6 = in_RDI->_connective;
  iVar5 = (int)(in_RDI->_label)._M_string_length;
  in_RDI->_connective = AND;
  *(undefined4 *)&in_RDI->field_0x4 = 0;
  *(undefined4 *)&in_RDI->_label = 0;
  *(int *)&(in_RDI->_label).field_0x4 = *(int *)&(in_RDI->_label).field_0x4 + 1;
  *(undefined4 *)&(in_RDI->_label)._M_string_length = uVar1;
  *(undefined4 *)((long)&(in_RDI->_label)._M_string_length + 4) =
       *(undefined4 *)(DHMapTableNextExpansions + (long)*(int *)&(in_RDI->_label).field_0x4 * 4);
  pEVar3 = array_new<Lib::DHMap<Kernel::Formula*,Shell::NewCNF::Occurrences,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                     (in_stack_ffffffffffffffb0,(size_t)in_RDI);
  (in_RDI->_label).field_2._M_allocated_capacity = (size_type)pEVar3;
  *(size_type *)((long)&(in_RDI->_label).field_2 + 8) =
       (in_RDI->_label).field_2._M_allocated_capacity +
       (long)(int)(in_RDI->_label)._M_string_length * 0x20;
  for (puVar4 = __ptr; puVar4 != puVar7; puVar4 = puVar4 + 8) {
    if ((*puVar4 >> 2 == CVar6) && ((*puVar4 & 1) == 0)) {
      val._8_8_ = puVar4;
      val._occurrences = *(List<Shell::NewCNF::Occurrence> **)(puVar4 + 6);
      insert(*(DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2>
               **)(puVar4 + 4),in_RDI,val);
    }
  }
  if (iVar5 != 0) {
    Lib::free(__ptr);
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }